

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void build_impute_node<InputData<double,unsigned_long>&,WorkerMemory<ImputedData<unsigned_long,double>,double,double>&,double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<unsigned_long,_double>,_double,_double> *workspace,
               InputData<double,_unsigned_long> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  unsigned_long uVar1;
  WeighImpRows WVar2;
  size_t sVar3;
  pointer pdVar4;
  pointer pdVar5;
  unsigned_long uVar6;
  unsigned_long *puVar7;
  pointer pIVar8;
  pointer pdVar9;
  double *pdVar10;
  bool bVar11;
  bool bVar12;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar13;
  ulong *puVar14;
  uchar *puVar15;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  size_t col;
  double *pdVar19;
  ulong *key;
  pointer pvVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  pointer puVar24;
  vector<double,_std::allocator<double>_> *pvVar25;
  size_t sVar26;
  size_t col_2;
  size_t col_1;
  InputData<double,_unsigned_long> *pIVar27;
  ulong uVar28;
  unsigned_long *puVar29;
  unsigned_long uVar30;
  long lVar31;
  size_t sVar32;
  long lVar33;
  long lVar34;
  undefined4 uVar35;
  int iVar40;
  double dVar36;
  undefined4 uVar41;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  pointer puVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar52;
  double dVar50;
  undefined1 auVar51 [16];
  double dVar53;
  undefined1 auVar54 [16];
  double dVar55;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar56;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> *__range3_1;
  double __tmp;
  size_t ix;
  tuple<> local_b1;
  InputData<double,_unsigned_long> *local_b0;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  pointer local_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_90;
  vector<double,_std::allocator<double>_> *local_88;
  pointer local_80;
  undefined1 local_78 [16];
  double local_60;
  unsigned_long local_58;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_50;
  size_t local_48;
  ModelParams *local_40;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_38;
  
  bVar11 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar12 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_b0 = input_data;
  local_50 = imputer_tree;
  local_48 = curr_depth;
  local_40 = model_params;
  if (bVar11 && bVar12) {
    lVar33 = (workspace->end - workspace->st) + 1;
    auVar37._8_4_ = (int)((ulong)lVar33 >> 0x20);
    auVar37._0_8_ = lVar33;
    auVar37._12_4_ = 0x45300000;
    dVar36 = auVar37._8_8_ - 1.9342813113834067e+25;
    local_78._0_8_ = dVar36 + ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0);
    local_78._8_8_ = dVar36;
  }
  else {
    local_78._0_8_ =
         calculate_sum_weights<double>
                   (&workspace->ix_arr,workspace->st,workspace->end,curr_depth,
                    &workspace->weights_arr,&workspace->weights_map);
    local_78._8_8_ = extraout_XMM0_Qb;
  }
  pIVar27 = local_b0;
  local_a8._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&imputer->num_sum,local_b0->ncols_numeric,(value_type_conflict *)&local_a8);
  local_a0 = &imputer->num_weight;
  local_a8._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_a0,pIVar27->ncols_numeric,(value_type_conflict *)&local_a8);
  local_90 = &imputer->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_90,pIVar27->ncols_categ);
  local_88 = &imputer->cat_weight;
  local_a8._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_88,pIVar27->ncols_categ,(value_type_conflict *)&local_a8);
  if ((imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
              (&imputer->num_sum);
  }
  if ((imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_a0)
    ;
  }
  pvVar13 = local_90;
  if ((imputer->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (imputer->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
    ::_S_do_it(local_90);
  }
  if ((imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_88)
    ;
  }
  uVar17 = local_b0->ncols_categ;
  if (uVar17 != 0) {
    lVar33 = 0;
    uVar28 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((pvVar13->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar33),(long)local_b0->ncat[uVar28]);
      pvVar20 = (pvVar13->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar33 + 0x10) !=
          *(long *)((long)&(pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar33 + 8)) {
        std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar33));
      }
      uVar28 = uVar28 + 1;
      uVar17 = local_b0->ncols_categ;
      lVar33 = lVar33 + 0x18;
    } while (uVar28 < uVar17);
  }
  auVar37 = _DAT_0036b1d0;
  sVar3 = local_b0->ncols_numeric;
  pIVar27 = local_b0;
  if ((uVar17 != 0) || (local_b0->Xc_indptr == (unsigned_long *)0x0 && sVar3 != 0)) {
    pdVar19 = local_b0->numeric_data;
    if (bVar11 && bVar12) {
      if (sVar3 != 0 && pdVar19 != (double *)0x0) {
        puVar24 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar28 = workspace->st;
        uVar21 = workspace->end;
        sVar22 = local_b0->nrows;
        pdVar4 = (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar26 = 0;
        do {
          dVar36 = 0.0;
          if (uVar28 <= uVar21) {
            pdVar5 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar33 = 0;
            uVar23 = uVar28;
            do {
              uVar35 = SUB164(ZEXT816(0x4530000043300000),0);
              uVar41 = SUB164(ZEXT816(0x4530000043300000),4);
              dVar36 = auVar37._0_8_;
              dVar53 = auVar37._8_8_;
              if ((ulong)ABS(pdVar19[sVar22 * sVar26 + puVar24[uVar23]]) < 0x7ff0000000000000) {
                lVar33 = lVar33 + 1;
                dVar50 = pdVar5[sVar26];
                auVar48._8_4_ = (int)((ulong)lVar33 >> 0x20);
                auVar48._0_8_ = lVar33;
                auVar48._12_4_ = uVar41;
                pdVar5[sVar26] =
                     (pdVar19[sVar22 * sVar26 + puVar24[uVar23]] - dVar50) /
                     ((auVar48._8_8_ - dVar53) + ((double)CONCAT44(uVar35,(int)lVar33) - dVar36)) +
                     dVar50;
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 <= uVar21);
            auVar47._8_4_ = (int)((ulong)lVar33 >> 0x20);
            auVar47._0_8_ = lVar33;
            auVar47._12_4_ = uVar41;
            dVar36 = (auVar47._8_8_ - dVar53) + ((double)CONCAT44(uVar35,(int)lVar33) - dVar36);
          }
          pdVar4[sVar26] = dVar36;
          sVar26 = sVar26 + 1;
        } while (sVar26 != sVar3);
      }
      piVar16 = local_b0->categ_data;
      if (uVar17 != 0 && piVar16 != (int *)0x0) {
        puVar24 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar28 = workspace->st;
        uVar21 = workspace->end;
        sVar3 = local_b0->nrows;
        pdVar4 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar23 = 0;
        dVar36 = (double)DAT_0036b1d0;
        dVar53 = DAT_0036b1d0._8_8_;
        do {
          dVar50 = 0.0;
          if (uVar28 <= uVar21) {
            pvVar20 = (local_90->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar33 = 0;
            uVar18 = uVar28;
            do {
              lVar34 = (long)piVar16[sVar3 * uVar23 + puVar24[uVar18]];
              if (-1 < lVar34) {
                lVar33 = lVar33 + 1;
                lVar31 = *(long *)&pvVar20[uVar23].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                *(double *)(lVar31 + lVar34 * 8) = *(double *)(lVar31 + lVar34 * 8) + 1.0;
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 <= uVar21);
            auVar49._8_4_ = (int)((ulong)lVar33 >> 0x20);
            auVar49._0_8_ = lVar33;
            auVar49._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar50 = (auVar49._8_8_ - dVar53) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar33) - dVar36);
          }
          pdVar4[uVar23] = dVar50;
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar17);
      }
    }
    else {
      if ((pdVar19 != (double *)0x0) && (local_b0->ncols_numeric != 0)) {
        uVar17 = 0;
        pvVar25 = local_a0;
        do {
          uVar28 = workspace->st;
          dVar36 = 0.0;
          if (uVar28 <= workspace->end) {
            lVar33 = uVar28 * 8;
            auVar45 = ZEXT816(0);
            do {
              puVar42 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar34 = *(long *)((long)puVar42 + lVar33);
              puVar24 = (pointer)pIVar27->numeric_data[lVar34 + pIVar27->nrows * uVar17];
              if ((ulong)ABS((double)puVar24) < 0x7ff0000000000000) {
                pdVar4 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar4) {
                  local_a8._M_head_impl = (unsigned_long *)((long)puVar42 + lVar33);
                  local_98 = (pointer)dVar36;
                  local_80 = puVar24;
                  local_60 = auVar45._0_8_;
                  pVar56 = tsl::detail_robin_hash::
                           robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           ::
                           insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                     ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                       *)&workspace->weights_map,local_a8._M_head_impl,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<const_unsigned_long_&> *)&local_a8,(tuple<> *)&local_58
                                     );
                  puVar15 = (pVar56.first.m_bucket.m_bucket)->m_value + 8;
                  pvVar25 = local_a0;
                  pIVar27 = local_b0;
                  dVar53 = local_60;
                  puVar42 = local_98;
                  puVar24 = local_80;
                }
                else {
                  puVar15 = (uchar *)(pdVar4 + lVar34);
                  dVar53 = auVar45._0_8_;
                  puVar42 = (pointer)dVar36;
                }
                dVar36 = *(double *)puVar15;
                pdVar4 = (pvVar25->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar4[uVar17] = dVar36 + pdVar4[uVar17];
                dVar53 = (double)puVar24 * dVar36 - dVar53;
                dVar36 = (double)puVar42 + dVar53;
                auVar45._0_8_ = (dVar36 - (double)puVar42) - dVar53;
                auVar45._8_8_ = 0;
              }
              uVar28 = uVar28 + 1;
              lVar33 = lVar33 + 8;
            } while (uVar28 <= workspace->end);
          }
          (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar17] =
               dVar36 / (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar17 < pIVar27->ncols_numeric);
      }
      if ((pIVar27->ncols_categ != 0) && (uVar17 = workspace->st, uVar17 <= workspace->end)) {
        do {
          local_58 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar17];
          pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar4) {
            local_a8._M_head_impl = &local_58;
            pVar56 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&local_58,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a8,&local_b1);
            puVar15 = (pVar56.first.m_bucket.m_bucket)->m_value + 8;
            pIVar27 = local_b0;
          }
          else {
            puVar15 = (uchar *)(pdVar4 + local_58);
          }
          sVar3 = pIVar27->ncols_categ;
          if (sVar3 != 0) {
            dVar36 = *(double *)puVar15;
            sVar22 = pIVar27->nrows;
            piVar16 = pIVar27->categ_data + local_58;
            pvVar20 = (local_90->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pdVar4 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            sVar26 = 0;
            do {
              lVar33 = (long)*piVar16;
              if (-1 < lVar33) {
                lVar34 = *(long *)&(pvVar20->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data;
                *(double *)(lVar34 + lVar33 * 8) = *(double *)(lVar34 + lVar33 * 8) + dVar36;
                pdVar4[sVar26] = pdVar4[sVar26] + dVar36;
              }
              sVar26 = sVar26 + 1;
              piVar16 = piVar16 + sVar22;
              pvVar20 = pvVar20 + 1;
            } while (sVar3 != sVar26);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 <= workspace->end);
      }
    }
  }
  auVar48 = _DAT_0036b1f0;
  auVar37 = _DAT_0036b1e0;
  if (pIVar27->Xc_indptr != (unsigned_long *)0x0) {
    puVar24 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar4 != pdVar5) {
      uVar17 = (long)pdVar5 + (-8 - (long)pdVar4);
      auVar38._8_4_ = (int)uVar17;
      auVar38._0_8_ = uVar17;
      auVar38._12_4_ = (int)(uVar17 >> 0x20);
      auVar39._0_8_ = uVar17 >> 3;
      auVar39._8_8_ = auVar38._8_8_ >> 3;
      uVar28 = 0;
      auVar39 = auVar39 ^ _DAT_0036b1f0;
      do {
        auVar46._8_4_ = (int)uVar28;
        auVar46._0_8_ = uVar28;
        auVar46._12_4_ = (int)(uVar28 >> 0x20);
        auVar47 = (auVar46 | auVar37) ^ auVar48;
        bVar11 = auVar39._0_4_ < auVar47._0_4_;
        iVar40 = auVar39._4_4_;
        iVar52 = auVar47._4_4_;
        if ((bool)(~(iVar40 < iVar52 || iVar52 == iVar40 && bVar11) & 1)) {
          pdVar4[uVar28] = (double)local_78._0_8_;
        }
        if (iVar40 >= iVar52 && (iVar52 != iVar40 || !bVar11)) {
          pdVar4[uVar28 + 1] = (double)local_78._0_8_;
        }
        uVar28 = uVar28 + 2;
      } while (((uVar17 >> 3) + 2 & 0xfffffffffffffffe) != uVar28);
    }
    if (pIVar27->ncols_numeric != 0) {
      local_98 = puVar24 + 1;
      local_38 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                  *)&workspace->weights_map;
      uVar17 = 0;
      pvVar25 = local_a0;
      local_80 = puVar24;
      do {
        uVar30 = pIVar27->Xc_indptr[uVar17];
        key = puVar24 + workspace->st;
        uVar28 = (long)((long)local_98 + (workspace->end * 8 - (long)key)) >> 3;
        if (0 < (long)uVar28) {
          do {
            uVar21 = uVar28 >> 1;
            uVar23 = ~uVar21 + uVar28;
            uVar28 = uVar21;
            if ((key + uVar21 + 1)[-1] < pIVar27->Xc_ind[uVar30]) {
              key = key + uVar21 + 1;
              uVar28 = uVar23;
            }
          } while (0 < (long)uVar28);
        }
        puVar14 = local_98 + workspace->end;
        puVar24 = local_80;
        if ((key != puVar14) && (uVar6 = pIVar27->Xc_indptr[uVar17 + 1], uVar30 != uVar6)) {
          uVar1 = uVar6 - 1;
          local_60 = (double)pIVar27->Xc_ind[uVar6 - 1];
          while (uVar28 = *key, uVar28 <= (ulong)local_60) {
            puVar29 = pIVar27->Xc_ind;
            uVar21 = puVar29[uVar30];
            if (uVar21 == uVar28) {
              local_90 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)pIVar27->Xc[uVar30];
              pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish == pdVar4) {
                dVar36 = 1.0;
                if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
                  local_a8._M_head_impl = key;
                  pVar56 = tsl::detail_robin_hash::
                           robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           ::
                           insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                     (local_38,key,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<const_unsigned_long_&> *)&local_a8,&local_b1);
                  puVar15 = (pVar56.first.m_bucket.m_bucket)->m_value + 8;
                  puVar24 = local_80;
                  pvVar25 = local_a0;
                  pIVar27 = local_b0;
                  goto LAB_00224984;
                }
              }
              else {
                puVar15 = (uchar *)(pdVar4 + uVar28);
LAB_00224984:
                dVar36 = *(double *)puVar15;
              }
              if ((ulong)ABS((double)local_90) < 0x7ff0000000000000) {
                pdVar4 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                pdVar4[uVar17] = dVar36 * (double)local_90 + pdVar4[uVar17];
              }
              else {
                pdVar4 = (pvVar25->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar4[uVar17] = pdVar4[uVar17] - dVar36;
              }
              if ((key == puVar24 + workspace->end) || (uVar30 == uVar1)) break;
              puVar7 = pIVar27->Xc_ind;
              puVar29 = puVar7 + uVar30;
              key = key + 1;
              uVar28 = (long)((long)puVar7 + (uVar1 * 8 - (long)puVar29) + 8) >> 3;
              if (0 < (long)uVar28) {
                do {
                  uVar21 = uVar28 >> 1;
                  uVar23 = ~uVar21 + uVar28;
                  uVar28 = uVar21;
                  if ((puVar29 + uVar21 + 1)[-1] < *key) {
                    puVar29 = puVar29 + uVar21 + 1;
                    uVar28 = uVar23;
                  }
                } while (0 < (long)uVar28);
              }
              lVar33 = (long)puVar29 - (long)puVar7;
LAB_00224a30:
              uVar30 = lVar33 >> 3;
            }
            else {
              if (uVar21 <= uVar28) {
                puVar7 = puVar29 + uVar30 + 1;
                uVar21 = (long)((long)puVar29 + (uVar1 * 8 - (long)(puVar29 + uVar30 + 1)) + 8) >> 3
                ;
                while (0 < (long)uVar21) {
                  uVar23 = uVar21 >> 1;
                  uVar18 = ~uVar23 + uVar21;
                  uVar21 = uVar23;
                  if ((puVar7 + uVar23 + 1)[-1] < uVar28) {
                    puVar7 = puVar7 + uVar23 + 1;
                    uVar21 = uVar18;
                  }
                }
                lVar33 = (long)puVar7 - (long)puVar29;
                goto LAB_00224a30;
              }
              key = key + 1;
              uVar28 = (long)puVar14 - (long)key >> 3;
              while (0 < (long)uVar28) {
                uVar23 = uVar28 >> 1;
                uVar18 = ~uVar23 + uVar28;
                uVar28 = uVar23;
                if ((key + uVar23 + 1)[-1] < uVar21) {
                  key = key + uVar23 + 1;
                  uVar28 = uVar18;
                }
              }
            }
            puVar14 = local_98 + workspace->end;
            if ((key == puVar14) || (uVar30 == uVar6)) break;
          }
        }
        pdVar4 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4[uVar17] =
             pdVar4[uVar17] /
             (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar17 < pIVar27->ncols_numeric);
    }
  }
  auVar43._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
  auVar43._8_4_ = (int)(min_imp_obs >> 0x20);
  auVar43._12_4_ = 0x45300000;
  dVar36 = (auVar43._8_8_ - 1.9342813113834067e+25) + (auVar43._0_8_ - 4503599627370496.0);
  pdVar4 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish != pdVar4) && (sVar3 = local_b0->ncols_numeric, sVar3 != 0)
     ) {
    pdVar5 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar22 = imputer->parent;
    pIVar8 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar26 = 0;
    do {
      pdVar19 = pdVar5 + sVar26;
      if (*pdVar19 <= dVar36 && dVar36 != *pdVar19) {
        dVar53 = *(double *)
                  (*(long *)&pIVar8[sVar22].num_sum.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  sVar26 * 8);
        dVar50 = 2.0;
        sVar32 = sVar22;
        if (0x7fefffffffffffff < (ulong)ABS(dVar53)) {
          lVar33 = 2;
          do {
            if (sVar32 == 0) {
              pdVar4[sVar26] = NAN;
              dVar50 = 0.0;
              goto LAB_00224bb7;
            }
            sVar32 = pIVar8[sVar32].parent;
            dVar53 = *(double *)
                      (*(long *)&pIVar8[sVar32].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar26 * 8);
            lVar33 = lVar33 + 2;
          } while (0x7fefffffffffffff < (ulong)ABS(dVar53));
          auVar54._8_4_ = (int)((ulong)lVar33 >> 0x20);
          auVar54._0_8_ = lVar33;
          auVar54._12_4_ = 0x45300000;
          dVar50 = (auVar54._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0);
        }
        pdVar4[sVar26] =
             dVar53 / *(double *)
                       (*(long *)&pIVar8[sVar32].num_weight.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       sVar26 * 8);
        dVar50 = (double)local_78._0_8_ / dVar50;
LAB_00224bb7:
        pdVar5[sVar26] = dVar50;
      }
      sVar26 = sVar26 + 1;
    } while (sVar26 != sVar3);
  }
  pvVar20 = (imputer->cat_sum).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((imputer->cat_sum).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != pvVar20) &&
     (sVar3 = local_b0->ncols_categ, sVar3 != 0)) {
    pdVar5 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar22 = imputer->parent;
    pIVar8 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar16 = local_b0->ncat;
    sVar26 = 0;
    do {
      if (dVar36 <= pdVar5[sVar26]) {
        pdVar10 = pvVar20[sVar26].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pdVar19 = pvVar20[sVar26].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar19 != pdVar10; pdVar19 = pdVar19 + 1)
        {
          *pdVar19 = *pdVar19 / pdVar5[sVar26];
        }
      }
      else {
        lVar33 = *(long *)&pIVar8[sVar22].cat_weight.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        dVar53 = 2.0;
        sVar32 = sVar22;
        if (*(double *)(lVar33 + sVar26 * 8) <= 0.0) {
          lVar34 = 2;
          do {
            if (sVar32 == 0) goto LAB_00224d10;
            sVar32 = pIVar8[sVar32].parent;
            lVar33 = *(long *)&pIVar8[sVar32].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            lVar34 = lVar34 + 2;
          } while (*(double *)(lVar33 + sVar26 * 8) <= 0.0);
          auVar51._8_4_ = (int)((ulong)lVar34 >> 0x20);
          auVar51._0_8_ = lVar34;
          auVar51._12_4_ = 0x45300000;
          dVar53 = (auVar51._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar34) - 4503599627370496.0);
        }
        iVar40 = piVar16[sVar26];
        if (0 < (long)iVar40) {
          lVar34 = *(long *)(*(long *)&pIVar8[sVar32].cat_sum.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl + sVar26 * 0x18);
          pdVar9 = pvVar20[sVar26].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar31 = 0;
          do {
            dVar50 = *(double *)(lVar34 + lVar31 * 8);
            dVar55 = 0.0;
            if (0.0 < dVar50) {
              dVar55 = dVar50 / *(double *)(lVar33 + sVar26 * 8);
            }
            pdVar9[lVar31] = dVar55 + pdVar9[lVar31];
            pdVar5[sVar26] = (double)local_78._0_8_ / dVar53;
            lVar31 = lVar31 + 1;
          } while (iVar40 != lVar31);
        }
LAB_00224d10:
        dVar53 = 0.0;
        for (pdVar19 = pvVar20[sVar26].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar19 !=
            pvVar20[sVar26].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar19 = pdVar19 + 1) {
          dVar53 = dVar53 + *pdVar19;
        }
        pdVar5[sVar26] = dVar53;
      }
      sVar26 = sVar26 + 1;
    } while (sVar26 != sVar3);
  }
  WVar2 = local_40->weigh_imp_rows;
  if (WVar2 == Flat) {
    pdVar10 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar19 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar19 != pdVar10; pdVar19 = pdVar19 + 1) {
      *pdVar19 = *pdVar19 / (double)local_78._0_8_;
    }
    pdVar10 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar19 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar19 != pdVar10; pdVar19 = pdVar19 + 1) {
      *pdVar19 = *pdVar19 / (double)local_78._0_8_;
    }
  }
  else if (WVar2 == Inverse) {
    pdVar10 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar19 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar19 != pdVar10; pdVar19 = pdVar19 + 1) {
      *pdVar19 = *pdVar19 / (SQRT((double)local_78._0_8_) * (double)local_78._0_8_);
    }
    pdVar10 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar19 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar19 != pdVar10; pdVar19 = pdVar19 + 1) {
      *pdVar19 = *pdVar19 / (SQRT((double)local_78._0_8_) * (double)local_78._0_8_);
    }
  }
  lVar33 = local_48 + 1;
  auVar44._8_4_ = (int)((ulong)lVar33 >> 0x20);
  auVar44._0_8_ = lVar33;
  auVar44._12_4_ = 0x45300000;
  dVar36 = (auVar44._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0);
  if (local_40->depth_imp == Higher) {
    pdVar10 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar19 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar19 != pdVar10; pdVar19 = pdVar19 + 1) {
      *pdVar19 = *pdVar19 * dVar36;
    }
    pdVar10 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar19 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar19 != pdVar10; pdVar19 = pdVar19 + 1) {
      *pdVar19 = *pdVar19 * dVar36;
    }
  }
  else if (local_40->depth_imp == Lower) {
    pdVar10 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar19 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar19 != pdVar10; pdVar19 = pdVar19 + 1) {
      *pdVar19 = *pdVar19 / dVar36;
    }
    pdVar10 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar19 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar19 != pdVar10; pdVar19 = pdVar19 + 1) {
      *pdVar19 = *pdVar19 / dVar36;
    }
  }
  if ((WVar2 != Prop) || (local_40->depth_imp != Same)) {
    sVar3 = local_b0->ncols_numeric;
    if (sVar3 != 0) {
      pdVar5 = (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar22 = 0;
      do {
        pdVar4[sVar22] = pdVar5[sVar22] * pdVar4[sVar22];
        sVar22 = sVar22 + 1;
      } while (sVar3 != sVar22);
    }
    sVar3 = local_b0->ncols_categ;
    if (sVar3 != 0) {
      piVar16 = local_b0->ncat;
      pdVar4 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar22 = 0;
      do {
        iVar40 = piVar16[sVar22];
        if (0 < (long)iVar40) {
          pdVar5 = pvVar20[sVar22].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar33 = 0;
          do {
            pdVar5[lVar33] = pdVar4[sVar22] * pdVar5[lVar33];
            lVar33 = lVar33 + 1;
          } while (iVar40 != lVar33);
        }
        sVar22 = sVar22 + 1;
      } while (sVar22 != sVar3);
    }
  }
  return;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}